

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* cmSystemTools::ParseArguments
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *cmd)

{
  bool bVar1;
  char *pcVar2;
  bool bVar3;
  char *local_58;
  char *c;
  char *command;
  undefined1 local_40 [7];
  bool win_path;
  string arg;
  string *cmd_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args;
  
  arg.field_2._M_local_buf[0xf] = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  std::__cxx11::string::string((string *)local_40);
  bVar1 = false;
  local_58 = (char *)std::__cxx11::string::c_str();
  if (((*local_58 != '\0') && (local_58[1] != '\0')) &&
     ((((*local_58 != '/' && ((local_58[1] == ':' && (local_58[2] == '\\')))) ||
       ((*local_58 == '\"' &&
        (((local_58[1] != '/' && (local_58[2] == ':')) && (local_58[3] == '\\')))))) ||
      ((((*local_58 == '\'' && (local_58[1] != '/')) &&
        ((local_58[2] == ':' && (local_58[3] == '\\')))) ||
       ((*local_58 == '\\' && (local_58[1] == '\\')))))))) {
    bVar1 = true;
  }
  while (*local_58 != '\0') {
    while( true ) {
      bVar3 = true;
      if (*local_58 != ' ') {
        bVar3 = *local_58 == '\t';
      }
      if (!bVar3) break;
      local_58 = local_58 + 1;
    }
    std::__cxx11::string::clear();
    pcVar2 = local_58;
    if (*local_58 == '\"') {
      while( true ) {
        local_58 = pcVar2 + 1;
        bVar3 = false;
        if (*local_58 != '\0') {
          bVar3 = *local_58 != '\"';
        }
        if (!bVar3) break;
        std::__cxx11::string::append((ulong)local_40,'\x01');
        pcVar2 = local_58;
      }
      if (*local_58 != '\0') {
        local_58 = pcVar2 + 2;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_40);
    }
    else if (*local_58 == '\'') {
      while( true ) {
        local_58 = pcVar2 + 1;
        bVar3 = false;
        if (*local_58 != '\0') {
          bVar3 = *local_58 != '\'';
        }
        if (!bVar3) break;
        std::__cxx11::string::append((ulong)local_40,'\x01');
        pcVar2 = local_58;
      }
      if (*local_58 != '\0') {
        local_58 = pcVar2 + 2;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_40);
    }
    else if (*local_58 != '\0') {
      while( true ) {
        local_58 = pcVar2;
        bVar3 = false;
        if ((*local_58 != '\0') && (bVar3 = false, *local_58 != ' ')) {
          bVar3 = *local_58 != '\t';
        }
        if (!bVar3) break;
        if ((*local_58 != '\\') || (bVar1)) {
          std::__cxx11::string::append((ulong)local_40,'\x01');
          pcVar2 = local_58 + 1;
        }
        else {
          pcVar2 = local_58 + 1;
          if (local_58[1] != '\0') {
            std::__cxx11::string::append((ulong)local_40,'\x01');
            pcVar2 = local_58 + 2;
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_40);
    }
  }
  arg.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)local_40);
  if ((arg.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> cmSystemTools::ParseArguments(const std::string& cmd)
{
  std::vector<std::string> args;
  std::string arg;

  bool win_path = false;

  const char* command = cmd.c_str();
  if (command[0] && command[1] &&
      ((command[0] != '/' && command[1] == ':' && command[2] == '\\') ||
       (command[0] == '\"' && command[1] != '/' && command[2] == ':' &&
        command[3] == '\\') ||
       (command[0] == '\'' && command[1] != '/' && command[2] == ':' &&
        command[3] == '\\') ||
       (command[0] == '\\' && command[1] == '\\'))) {
    win_path = true;
  }
  // Split the command into an argv array.
  for (const char* c = command; *c;) {
    // Skip over whitespace.
    while (*c == ' ' || *c == '\t') {
      ++c;
    }
    arg.clear();
    if (*c == '"') {
      // Parse a quoted argument.
      ++c;
      while (*c && *c != '"') {
        arg.append(1, *c);
        ++c;
      }
      if (*c) {
        ++c;
      }
      args.push_back(arg);
    } else if (*c == '\'') {
      // Parse a quoted argument.
      ++c;
      while (*c && *c != '\'') {
        arg.append(1, *c);
        ++c;
      }
      if (*c) {
        ++c;
      }
      args.push_back(arg);
    } else if (*c) {
      // Parse an unquoted argument.
      while (*c && *c != ' ' && *c != '\t') {
        if (*c == '\\' && !win_path) {
          ++c;
          if (*c) {
            arg.append(1, *c);
            ++c;
          }
        } else {
          arg.append(1, *c);
          ++c;
        }
      }
      args.push_back(arg);
    }
  }

  return args;
}